

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<TFad<6,_double>_>::dJ3
          (TPZTensor<TFad<6,_double>_> *this,TPZTensor<TFad<6,_double>_> *deriv)

{
  TFad<6,_double> *e;
  TFad<6,_double> *t;
  TFad<6,_double> *e1;
  TFad<6,_double> *e2;
  TFad<6,_double> *this_00;
  TFad<6,_double> *fadexpr;
  long in_RSI;
  long in_RDI;
  TFad<6,_double> state5;
  TFad<6,_double> statex4;
  TFad<6,_double> state4;
  TFad<6,_double> state3;
  TFad<6,_double> statex2;
  TFad<6,_double> state2;
  TFad<6,_double> statex1;
  TFad<6,_double> state1;
  TFad<6,_double> state0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *in_stack_ffffffffffffef18;
  TFad<6,_double> *in_stack_ffffffffffffef28;
  TFad<6,_double> *in_stack_ffffffffffffef30;
  TFad<6,_double> *in_stack_ffffffffffffef50;
  TFad<6,_double> *in_stack_ffffffffffffef58;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *in_stack_ffffffffffffef60;
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  *in_stack_ffffffffffffef68;
  
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  TFad<6,_double>::TFad(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),0);
  TFad<6,double>::operator=
            (in_stack_ffffffffffffef30,
             (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
              *)in_stack_ffffffffffffef28);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc65c);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc669);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc676);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc683);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bc690);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc69d);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc6aa);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc6b7);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bc6c4);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc6d1);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc6de);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc6eb);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bc6f8);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc705);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc712);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc71f);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc72c);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc739);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc746);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bc753);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc760);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc76d);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc77a);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc787);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc794);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bc7a1);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc7ae);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc7bb);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bc7c8);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bc7d5);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bc7e2);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  TFad<6,double>::operator=
            (in_stack_ffffffffffffef30,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)in_stack_ffffffffffffef28);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14bcb7f);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcb8c);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14bcb99);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcba6);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bcbb3);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bcbc0);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bcbcd);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcbda);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bcbe7);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bcbf4);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcc01);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bcc0e);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bcc1b);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcc28);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bcc35);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bcc42);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bcc4f);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcc5c);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bcc69);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bcc76);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcc83);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bcc90);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bcc9d);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  TFad<6,double>::operator=
            (in_stack_ffffffffffffef30,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)in_stack_ffffffffffffef28);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14bd03a);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd047);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd054);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd061);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd06e);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd07b);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bd088);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd095);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd0a2);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd0af);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd0bc);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd0c9);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd0d6);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd0e3);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd0f0);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14bd0fd);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd10a);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd117);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bd124);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd131);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd13e);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd14b);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd158);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator-(in_stack_ffffffffffffef18);
  ::operator/((TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),3);
  TFad<6,double>::operator=
            (in_stack_ffffffffffffef30,
             (TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
              *)in_stack_ffffffffffffef28);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd8bc);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd8c9);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd8d6);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd8e3);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bd8f0);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd8fd);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd90a);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd917);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bd924);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd931);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd93e);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd94b);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd958);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd965);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd972);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bd97f);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd98c);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd999);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd9a6);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bd9b3);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd9c0);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bd9cd);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bd9da);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bd9e7);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bd9f4);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bda01);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bda0e);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bda1b);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bda28);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
               *)0x14bda35);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bda42);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  TFad<6,double>::operator=
            (in_stack_ffffffffffffef30,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
              *)in_stack_ffffffffffffef28);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bdddf);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bddec);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bddf9);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bde06);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bde13);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bde20);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bde2d);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bde3a);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bde47);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bde54);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14bde61);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bde6e);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14bde7b);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bde88);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bde95);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bdea2);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bdeaf);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14bdebc);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bdec9);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bded6);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14bdee3);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14bdef0);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14bdefd);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator-(in_stack_ffffffffffffef18);
  ::operator/((TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((value_type *)in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
  ::operator/(in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef68,(value_type *)in_stack_ffffffffffffef60);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  e = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  ::operator*(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e,
              (value_type *)in_stack_ffffffffffffef60);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)in_stack_ffffffffffffef58,
              (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_ffffffffffffef50);
  t = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  e1 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  ::operator*(e1,in_stack_ffffffffffffef50);
  ::operator/((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e,(value_type *)t);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
                     *)in_stack_ffffffffffffef50);
  e2 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(e1,e2);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e,(value_type *)t);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)e,(value_type *)t);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
                     *)e2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(e1,e2);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e,(value_type *)t);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)e,(value_type *)t);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
                     *)e2);
  this_00 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  fadexpr = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  ::operator*(e1,e2);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e,(value_type *)t);
  ::operator/((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)e,(value_type *)t);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
                     *)e2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),5);
  TFad<6,double>::operator=
            (this_00,(TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
                      *)fadexpr);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be607);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14be614);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14be621);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be62e);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be63b);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14be648);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14be655);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be662);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be66f);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14be67c);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14be689);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be696);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be6a3);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14be6b0);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be6bd);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be6ca);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14be6d7);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be6e4);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be6f1);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFadCst<double>_>_>
               *)0x14be6fe);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14be70b);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be718);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be725);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14be732);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be73f);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14be74c);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
               *)0x14be759);
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14be766);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be773);
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadCst<double>_>_>
               *)0x14be780);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14be78d);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be79a);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be7a7);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be7b4);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be7c1);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be7ce);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be7db);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be7e8);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be7f5);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14be802);
  return;
}

Assistant:

void TPZTensor<T>::dJ3(TPZTensor<T> &deriv) const {
    T state0(fData[_XX_]), state1(fData[_XY_]), statex1(fData[_XY_]),
            state2(fData[_XZ_]), statex2(fData[_XZ_]), state3(fData[_YY_]),
            state4(fData[_YZ_]), statex4(fData[_YZ_]), state5(fData[_ZZ_]);
    deriv.fData[_XX_] = (fData[_XX_] * fData[_XX_]*2.) / 9. + fData[_XY_] * fData[_XY_] / 3. +
            fData[_XZ_] * fData[_XZ_] / 3. - (fData[_XX_] * fData[_YY_]*2.) / 9. -
            fData[_YY_] * fData[_YY_] / 9. - (fData[_YZ_] * fData[_YZ_]*2.) / 3. - (fData[_XX_] * fData[_ZZ_]*2.) /
            9. + (fData[_YY_] * fData[_ZZ_]*4.) / 9. - fData[_ZZ_] * fData[_ZZ_] / 9.;
    deriv.fData[_XY_] = (state0 * state1) / 3. + (state1 * state3) / 3. -
            (state1 * state5 * 2.) / 3. + (state0 * statex1) / 3. +
            (state3 * statex1) / 3. - (state5 * statex1 * 2.) / 3. +
            state4 * statex2 + state2*statex4;
    deriv.fData[_XZ_] = (state0 * state2) / 3. - (state2 * state3 * 2.) / 3. +
            state1 * state4 + (state2 * state5) / 3. +
            (state0 * statex2) / 3. - (state3 * statex2 * 2.) / 3. +
            (state5 * statex2) / 3. + statex1*statex4;
    deriv.fData[_YY_] = -(fData[_XX_] * fData[_XX_]) / 9. +
            (fData[_XY_] * fData[_XY_]) / 3. - ((fData[_XZ_] * fData[_XZ_])*2.) / 3. - (fData[_XX_] * fData[_YY_]*2.) / 9. + ((fData[_YY_] * fData[_YY_])*2.) / 9. +
            (fData[_YZ_] * fData[_YZ_]) / 3. + (fData[_XX_] * fData[_ZZ_]*4.) / 9. - (fData[_YY_] * fData[_ZZ_]*2.) / 9. -
            (fData[_ZZ_] * fData[_ZZ_]) / 9.;
    deriv.fData[_YZ_] = (state0 * state4 * (-2.)) / 3. + (state3 * state4) / 3. +
            (state4 * state5) / 3. + state2 * statex1 +
            state1 * statex2 - (state0 * statex4 * 2.) / 3. +
            (state3 * statex4) / 3. + (state5 * statex4) / 3.;
    deriv.fData[_ZZ_] = -(fData[_XX_] * fData[_XX_]) / 9. - (2. * (fData[_XY_] * fData[_XY_])) / 3. +
            (fData[_XZ_] * fData[_XZ_]) / 3. + (fData[_XX_] * fData[_YY_]*4.) / 9. - (fData[_YY_] * fData[_YY_]) / 9. +
            (fData[_YZ_] * fData[_YZ_]) / 3. - (fData[_XX_] * fData[_ZZ_]*2.) / 9. - (fData[_YY_] * fData[_ZZ_]*2.) /
            9. + ((fData[_ZZ_] * fData[_ZZ_])*2.) / 9.;

}